

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
::parallel_hash_set(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                    *this,size_t bucket_cnt,allocator_type *alloc)

{
  StatefulTestingEqual local_30;
  StatefulTestingHash local_28;
  allocator_type *local_20;
  allocator_type *alloc_local;
  size_t bucket_cnt_local;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *this_local;
  
  local_20 = alloc;
  alloc_local = (allocator_type *)bucket_cnt;
  bucket_cnt_local = (size_t)this;
  memset(&local_28,0,8);
  StatefulTestingHash::StatefulTestingHash(&local_28);
  memset(&local_30,0,8);
  StatefulTestingEqual::StatefulTestingEqual(&local_30);
  parallel_hash_set(this,bucket_cnt,&local_28,&local_30,local_20);
  return;
}

Assistant:

parallel_hash_set(size_t bucket_cnt, const allocator_type& alloc)
        : parallel_hash_set(bucket_cnt, hasher(), key_equal(), alloc) {}